

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

void tnt_io_sendv_put(tnt_stream_net *s,iovec *iov,int count)

{
  int local_20;
  int i;
  int count_local;
  iovec *iov_local;
  tnt_stream_net *s_local;
  
  for (local_20 = 0; local_20 < count; local_20 = local_20 + 1) {
    memcpy((s->sbuf).buf + (s->sbuf).off,iov[local_20].iov_base,iov[local_20].iov_len);
    (s->sbuf).off = iov[local_20].iov_len + (s->sbuf).off;
  }
  return;
}

Assistant:

inline static void
tnt_io_sendv_put(struct tnt_stream_net *s, struct iovec *iov, int count) {
	int i;
	for (i = 0 ; i < count ; i++) {
		memcpy(s->sbuf.buf + s->sbuf.off,
		       iov[i].iov_base,
		       iov[i].iov_len);
		s->sbuf.off += iov[i].iov_len;
	}
}